

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

void boost::filesystem::detail::directory_iterator_construct
               (directory_iterator *it,path *p,error_code *ec)

{
  bool bVar1;
  int error_num;
  type pdVar2;
  type pdVar3;
  value_type *dir;
  unspecified_bool_type p_Var4;
  char *pcVar5;
  long lVar6;
  error_code eVar7;
  err_t local_c4;
  file_status local_c0;
  file_status local_b8;
  path local_b0;
  path local_90;
  undefined4 local_70;
  undefined1 local_60 [8];
  error_code result;
  file_status symlink_file_stat;
  file_status file_stat;
  string_type filename;
  error_code *ec_local;
  path *p_local;
  directory_iterator *it_local;
  
  bVar1 = filesystem::path::empty(p);
  if (bVar1) {
    local_c4 = system::error_code::value((error_code *)(anonymous_namespace)::not_found_error_code);
  }
  else {
    local_c4 = 0;
  }
  bVar1 = anon_unknown.dwarf_522f::error
                    (local_c4,p,ec,"boost::filesystem::directory_iterator::construct");
  if (!bVar1) {
    std::__cxx11::string::string((string *)&file_stat);
    file_status::file_status(&symlink_file_stat);
    file_status::file_status((file_status *)&result.m_cat);
    pdVar2 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
    pdVar3 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
    dir = filesystem::path::c_str(p);
    eVar7 = anon_unknown.dwarf_522f::dir_itr_first
                      (&pdVar2->handle,&pdVar3->buffer,dir,(string *)&file_stat,&symlink_file_stat,
                       (file_status *)&result.m_cat);
    result._0_8_ = eVar7.m_cat;
    local_60._0_4_ = eVar7.m_val;
    p_Var4 = system::error_code::operator_cast_to_function_pointer((error_code *)local_60);
    if (p_Var4 == (unspecified_bool_type)0x0) {
      pdVar2 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
      if (pdVar2->handle == (void *)0x0) {
        shared_ptr<boost::filesystem::detail::dir_itr_imp>::reset(&it->m_imp);
      }
      else {
        pdVar2 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
        filesystem::path::path(&local_b0,(string_type *)&file_stat);
        operator/(&local_90,p,&local_b0);
        file_status::file_status(&local_b8,&symlink_file_stat);
        file_status::file_status(&local_c0,(file_status *)&result.m_cat);
        directory_entry::assign(&pdVar2->dir_entry,&local_90,&local_b8,&local_c0);
        filesystem::path::~path(&local_90);
        filesystem::path::~path(&local_b0);
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&file_stat);
        if ((*pcVar5 == '.') &&
           ((lVar6 = std::__cxx11::string::size(), lVar6 == 1 ||
            ((pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&file_stat), *pcVar5 == '.'
             && (lVar6 = std::__cxx11::string::size(), lVar6 == 2)))))) {
          directory_iterator::increment(it,ec);
        }
      }
      local_70 = 0;
    }
    else {
      shared_ptr<boost::filesystem::detail::dir_itr_imp>::reset(&it->m_imp);
      error_num = system::error_code::value((error_code *)local_60);
      anon_unknown.dwarf_522f::error
                (error_num,p,ec,"boost::filesystem::directory_iterator::construct");
      local_70 = 1;
    }
    std::__cxx11::string::~string((string *)&file_stat);
  }
  return;
}

Assistant:

void directory_iterator_construct(directory_iterator& it,
    const path& p, system::error_code* ec)    
  {
    if (error(p.empty() ? not_found_error_code.value() : 0, p, ec,
              "boost::filesystem::directory_iterator::construct"))
      return;

    path::string_type filename;
    file_status file_stat, symlink_file_stat;
    error_code result = dir_itr_first(it.m_imp->handle,
#     if defined(BOOST_POSIX_API)
      it.m_imp->buffer,
#     endif
      p.c_str(), filename, file_stat, symlink_file_stat);

    if (result)
    {
      it.m_imp.reset();
      error(result.value(), p,
        ec, "boost::filesystem::directory_iterator::construct");
      return;
    }
    
    if (it.m_imp->handle == 0)
      it.m_imp.reset(); // eof, so make end iterator
    else // not eof
    {
      it.m_imp->dir_entry.assign(p / filename, file_stat, symlink_file_stat);
      if (filename[0] == dot // dot or dot-dot
        && (filename.size()== 1
          || (filename[1] == dot
            && filename.size()== 2)))
        {  it.increment(*ec); }
    }
  }